

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_ori_to_ccr(m68k_info *info)

{
  uint imm;
  
  imm = read_imm_8(info);
  build_imm_special_reg(info,0x129,imm,1,M68K_REG_CCR);
  return;
}

Assistant:

static void d68000_ori_to_ccr(m68k_info *info)
{
	build_imm_special_reg(info, M68K_INS_ORI, read_imm_8(info), 1, M68K_REG_CCR);
}